

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O3

wchar_t archive_acl_add_entry_w_len
                  (archive_acl *acl,wchar_t type,wchar_t permset,wchar_t tag,wchar_t id,
                  wchar_t *name,size_t len)

{
  wchar_t wVar1;
  archive_acl_entry *paVar2;
  wchar_t wVar3;
  
  wVar1 = acl_special(acl,type,permset,tag);
  wVar3 = L'\0';
  if (wVar1 != L'\0') {
    paVar2 = acl_new_entry(acl,type,permset,tag,id);
    if (paVar2 == (archive_acl_entry *)0x0) {
      wVar3 = L'\xffffffe7';
    }
    else {
      wVar3 = L'\0';
      if (((name == (wchar_t *)0x0) || (len == 0)) || (*name == L'\0')) {
        archive_mstring_clean(&paVar2->name);
      }
      else {
        archive_mstring_copy_wcs_len(&paVar2->name,name,len);
      }
    }
  }
  return wVar3;
}

Assistant:

int
archive_acl_add_entry_w_len(struct archive_acl *acl,
    int type, int permset, int tag, int id, const wchar_t *name, size_t len)
{
	struct archive_acl_entry *ap;

	if (acl_special(acl, type, permset, tag) == 0)
		return ARCHIVE_OK;
	ap = acl_new_entry(acl, type, permset, tag, id);
	if (ap == NULL) {
		/* XXX Error XXX */
		return ARCHIVE_FAILED;
	}
	if (name != NULL  &&  *name != L'\0' && len > 0)
		archive_mstring_copy_wcs_len(&ap->name, name, len);
	else
		archive_mstring_clean(&ap->name);
	return ARCHIVE_OK;
}